

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrixVector.h
# Opt level: O0

void Eigen::internal::
     triangular_product_impl<5,false,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>const,-1,1,true>const,-1,1,false>const>const>,true,Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>const,-1,-1,false>const,false>
     ::run<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>
               (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>
                *dst,CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
                     *lhs,
               Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
               *rhs,Scalar *alpha)

{
  Index IVar1;
  Index IVar2;
  bool bVar3;
  ConstTransposeReturnType local_1b8;
  ConstTransposeReturnType local_f8;
  undefined1 local_90 [8];
  Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
  dstT;
  Scalar *alpha_local;
  Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
  *rhs_local;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
  *lhs_local;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>
  *dst_local;
  
  dstT.m_matrix.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false,_true>
  .m_outerStride = (Index)alpha;
  IVar1 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>,_0>
          ::rows((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>,_0>
                  *)dst);
  IVar2 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>
          ::rows(lhs);
  bVar3 = false;
  if (IVar1 == IVar2) {
    IVar1 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>,_0>
            ::cols((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>,_0>
                    *)dst);
    IVar2 = MapBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
            ::cols((MapBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
                    *)rhs);
    bVar3 = IVar1 == IVar2;
  }
  if (!bVar3) {
    __assert_fail("dst.rows()==lhs.rows() && dst.cols()==rhs.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/products/TriangularMatrixVector.h"
                  ,0xbd,
                  "static void Eigen::internal::triangular_product_impl<5, false, Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Transpose<const Eigen::Block<const Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, -1, 1>>>, true, const Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, -1>>>, false>::run(Dest &, const Lhs &, const Rhs &, const typename Dest::Scalar &) [Mode = 5, LhsIsTriangular = false, Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Transpose<const Eigen::Block<const Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, -1, 1>>>, LhsIsVector = true, Rhs = const Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, -1>>>, RhsIsVector = false, Dest = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1, 1, -1, -1>, 1, -1, true>, 1>]"
                 );
  }
  Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>_>
  ::Transpose((Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
               *)local_90,dst);
  DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>
  ::transpose(&local_f8,
              (DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
               *)rhs);
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>
  ::transpose(&local_1b8,
              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
               *)lhs);
  trmv_selector<6,1>::
  run<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>const,_1,_1,false>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>const,_1,1,true>const,_1,1,false>const>const>const>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>>
            (&local_f8,&local_1b8,
             (Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
              *)local_90,
             (Scalar *)
             dstT.m_matrix.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false,_true>
             .m_outerStride);
  return;
}

Assistant:

static void run(Dest& dst, const Lhs &lhs, const Rhs &rhs, const typename Dest::Scalar& alpha)
  {
    eigen_assert(dst.rows()==lhs.rows() && dst.cols()==rhs.cols());

    Transpose<Dest> dstT(dst);
    internal::trmv_selector<(Mode & (UnitDiag|ZeroDiag)) | ((Mode & Lower) ? Upper : Lower),
                            (int(internal::traits<Rhs>::Flags)&RowMajorBit) ? ColMajor : RowMajor>
            ::run(rhs.transpose(),lhs.transpose(), dstT, alpha);
  }